

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O0

PaError BoostPriority(PaUnixThread *self)

{
  int iVar1;
  int *piVar2;
  sched_param local_18;
  PaError local_14;
  sched_param spm;
  PaError result;
  PaUnixThread *self_local;
  
  local_14 = 0;
  _spm = self;
  memset(&local_18,0,4);
  local_18.__sched_priority = 1;
  if (_spm != (PaUnixThread *)0x0) {
    iVar1 = pthread_setschedparam(_spm->thread,1,&local_18);
    if (iVar1 == 0) {
      local_14 = 1;
    }
    else {
      piVar2 = __errno_location();
      if (*piVar2 == 1) {
        local_14 = 0;
      }
      else {
        PaUtil_DebugPrint(
                         "Expression \'errno == EPERM\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/os/unix/pa_unix_util.c\', line: 256\n"
                         );
        local_14 = -0x2702;
      }
    }
    return local_14;
  }
  __assert_fail("self",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/os/unix/pa_unix_util.c"
                ,0xfc,"PaError BoostPriority(PaUnixThread *)");
}

Assistant:

static PaError BoostPriority( PaUnixThread* self )
{
    PaError result = paNoError;
    struct sched_param spm = { 0 };
    /* Priority should only matter between contending FIFO threads? */
    spm.sched_priority = 1;

    assert( self );

    if( pthread_setschedparam( self->thread, SCHED_FIFO, &spm ) != 0 )
    {
        PA_UNLESS( errno == EPERM, paInternalError );  /* Lack permission to raise priority */
        PA_DEBUG(( "Failed bumping priority\n" ));
        result = 0;
    }
    else
    {
        result = 1; /* Success */
    }
error:
    return result;
}